

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mark.hpp
# Opt level: O2

void __thiscall
bm::Mark::Mark<long,std::ratio<1l,1000000000l>>
          (Mark *this,duration<long,_std::ratio<1L,_1000000000L>_> *duration)

{
  (this->_overflow_callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_overflow_callback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->_overflow_callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_overflow_callback).super__Function_base._M_functor + 8) = 0;
  (this->_min).__r = 0x7fffffffffffffff;
  (this->_max).__r = -0x8000000000000000;
  (this->_total).__r = 0;
  this->_iterations = 0;
  add<long,std::ratio<1l,1000000000l>>(this,duration);
  return;
}

Assistant:

explicit Mark(const std::chrono::duration<Rep, Period>& duration)
    {
        clear();
        (void)add(duration);
    }